

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

int handle_add_dirafter(dmr_C *C,stream *stream,token **line,token *token)

{
  position pos;
  char **ppcVar1;
  char **ppcVar2;
  
  while( true ) {
    token = token->next;
    if (token == &dmrC_eof_token_entry_) {
      return 1;
    }
    pos = token->pos;
    if ((pos._0_4_ & 0x3f) != 0xf) break;
    if (C->includepath[0x12a] != (char *)0x0) {
      dmrC_error_die(C,pos,"too many include path entries");
    }
    ppcVar1 = C->includepath;
    do {
      ppcVar2 = ppcVar1;
      ppcVar1 = ppcVar2 + 1;
    } while (*ppcVar2 != (char *)0x0);
    *ppcVar2 = (char *)((long)&((token->field_2).ident)->next + 4);
    ppcVar2[1] = (char *)0x0;
  }
  dmrC_sparse_error(C,pos,"expected path string");
  return 1;
}

Assistant:

static int handle_add_dirafter(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token)
{
        (void) line;
        (void) stream;
	for (;;) {
		token = token->next;
		if (dmrC_eof_token(token))
			return 1;
		if (dmrC_token_type(token) != TOKEN_STRING) {
			dmrC_sparse_error(C, token->pos, "expected path string");
			return 1;
		}
		add_dirafter_entry(C, token, token->string->data);
	}
}